

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateDebugReportObjectType
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *objectType)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer ppVar2;
  allocator<char> local_a9;
  _Self local_a8;
  allocator<char> local_99;
  key_type local_98;
  _Self local_78;
  const_iterator enumIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string debugReportObjectType;
  string *objectType_local;
  VulkanHppGenerator *this_local;
  
  debugReportObjectType.field_2._8_8_ = objectType;
  std::__cxx11::string::string((string *)local_40,objectType);
  __lhs = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,3
                     ,0,"DEBUG_REPORT_");
  std::operator+(&local_60,__lhs,"_EXT");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,&local_60
            );
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"VkDebugReportObjectTypeEXT",&local_99);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
       ::find(&this->m_enums,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
       ::end(&this->m_enums);
  bVar1 = std::operator==(&local_78,&local_a8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>
             ::operator->(&local_78);
    bVar1 = contains(this,&(ppVar2->second).values,(string *)local_40);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>
               ::operator->(&local_78);
      generateEnumValueName(__return_storage_ptr__,this,&ppVar2->first,(string *)local_40,false);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"eUnknown",&local_a9);
      std::allocator<char>::~allocator(&local_a9);
    }
    std::__cxx11::string::~string((string *)local_40);
    return __return_storage_ptr__;
  }
  __assert_fail("enumIt != m_enums.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x1972,
                "std::string VulkanHppGenerator::generateDebugReportObjectType(const std::string &) const"
               );
}

Assistant:

std::string VulkanHppGenerator::generateDebugReportObjectType( std::string const & objectType ) const
{
  std::string debugReportObjectType = objectType;
  debugReportObjectType             = debugReportObjectType.replace( 3, 0, "DEBUG_REPORT_" ) + "_EXT";
  auto enumIt                       = m_enums.find( "VkDebugReportObjectTypeEXT" );
  assert( enumIt != m_enums.end() );
  return contains( enumIt->second.values, debugReportObjectType ) ? generateEnumValueName( enumIt->first, debugReportObjectType, false ) : "eUnknown";
}